

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_to_string_Test::TestBody
          (WelcomeMessageTest_test_to_string_Test *this)

{
  bool bVar1;
  char *message_00;
  AssertionResult gtest_ar;
  WelcomeMessage message;
  AssertHelper local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  WelcomeMessage local_28 [24];
  
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage(local_28,1,0xe807e361,0xde3c3f54);
  bidfx_public_api::price::pixie::WelcomeMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[61],std::__cxx11::string>
            (local_38,"\"Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)\"",
             "message.ToString()",
             (char (*) [61])"Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)",&local_58
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x5d,message_00);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_to_string)
{
    WelcomeMessage message = WelcomeMessage(1, 3892831073, 3728490324);
    ASSERT_EQ("Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)", message.ToString());
}